

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O2

_Bool square_isinemptysquare(chunk_conflict *c,loc grid)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  loc grid_00;
  wchar_t wVar4;
  
  wVar4 = grid.y + L'\x02';
  for (wVar2 = grid.y + L'\xfffffffe'; wVar3 = grid.x + L'\xfffffffe', wVar2 <= wVar4;
      wVar2 = wVar2 + L'\x01') {
    while (wVar3 <= grid.x + L'\x02') {
      grid_00.y = wVar2;
      grid_00.x = wVar3;
      _Var1 = square_in_bounds(c,grid_00);
      if (!_Var1) goto LAB_00127471;
      _Var1 = square_isfloor(c,grid_00);
      wVar3 = wVar3 + L'\x01';
      if (!_Var1) goto LAB_00127471;
    }
  }
LAB_00127471:
  return wVar4 < wVar2;
}

Assistant:

bool square_isinemptysquare(struct chunk *c, struct loc grid)
{
	struct loc test;
	for (test.y = grid.y - 2; test.y <= grid.y + 2; test.y++) {
		for (test.x = grid.x - 2; test.x <= grid.x + 2; test.x++) {
			if (!square_in_bounds(c, test)) return false;
			if (!square_isfloor(c, test)) return false;
		}
	}
	return true;
}